

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webserver.c
# Opt level: O3

int web_server_set_alias
              (char *alias_name,char *alias_content,size_t alias_content_length,time_t last_modified
              )

{
  int iVar1;
  long lVar2;
  membuffer *pmVar3;
  xml_alias_t *pxVar4;
  byte bVar5;
  xml_alias_t alias;
  membuffer local_80;
  membuffer local_60;
  time_t local_40;
  undefined4 *local_38;
  
  bVar5 = 0;
  alias_release(&gAliasDoc);
  if (alias_name == (char *)0x0) {
    return 0;
  }
  if (alias_content != (char *)0x0) {
    membuffer_init(&local_60);
    membuffer_init(&local_80);
    local_38 = (undefined4 *)0x0;
    if ((((*alias_name == '/') || (iVar1 = membuffer_assign_str(&local_80,"/"), iVar1 == 0)) &&
        (iVar1 = membuffer_append_str(&local_80,alias_name), iVar1 == 0)) &&
       (local_38 = (undefined4 *)malloc(4), local_38 != (undefined4 *)0x0)) {
      *local_38 = 1;
      membuffer_attach(&local_60,alias_content,alias_content_length);
      local_40 = last_modified;
      pthread_mutex_lock((pthread_mutex_t *)&gWebMutex);
      pmVar3 = &local_80;
      pxVar4 = &gAliasDoc;
      for (lVar2 = 10; lVar2 != 0; lVar2 = lVar2 + -1) {
        (pxVar4->name).buf = pmVar3->buf;
        pmVar3 = (membuffer *)((long)pmVar3 + ((ulong)bVar5 * -2 + 1) * 8);
        pxVar4 = (xml_alias_t *)((long)pxVar4 + ((ulong)bVar5 * -2 + 1) * 8);
      }
      pthread_mutex_unlock((pthread_mutex_t *)&gWebMutex);
      return 0;
    }
    membuffer_destroy(&local_80);
    membuffer_destroy(&local_60);
    free(local_38);
    return -0x68;
  }
  __assert_fail("alias_content != NULL",".upnp/src/genlib/net/http/webserver.c",0x1b5,
                "int web_server_set_alias(const char *, const char *, size_t, time_t)");
}

Assistant:

int web_server_set_alias(const char *alias_name,
	const char *alias_content,
	size_t alias_content_length,
	time_t last_modified)
{
	int ret_code;
	struct xml_alias_t alias;

	alias_release(&gAliasDoc);
	if (alias_name == NULL) {
		/* don't serve aliased doc anymore */
		return 0;
	}
	assert(alias_content != NULL);
	membuffer_init(&alias.doc);
	membuffer_init(&alias.name);
	alias.ct = NULL;
	do {
		/* insert leading /, if missing */
		if (*alias_name != '/')
			if (membuffer_assign_str(&alias.name, "/") != 0)
				break; /* error; out of mem */
		ret_code = membuffer_append_str(&alias.name, alias_name);
		if (ret_code != 0)
			break; /* error */
		if ((alias.ct = (int *)malloc(sizeof(int))) == NULL)
			break; /* error */
		*alias.ct = 1;
		membuffer_attach(&alias.doc,
			(char *)alias_content,
			alias_content_length);
		alias.last_modified = last_modified;
		/* save in module var */
		ithread_mutex_lock(&gWebMutex);
		gAliasDoc = alias;
		ithread_mutex_unlock(&gWebMutex);

		return 0;
	} while (0);
	/* error handler */
	/* free temp alias */
	membuffer_destroy(&alias.name);
	membuffer_destroy(&alias.doc);
	free(alias.ct);

	return UPNP_E_OUTOF_MEMORY;
}